

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O0

void __thiscall
HighsSimplexAnalysis::dualSteepestEdgeWeightError
          (HighsSimplexAnalysis *this,double computed_edge_weight,double updated_edge_weight)

{
  double dVar1;
  double *pdVar2;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  double in_XMM1_Qa;
  bool report_weight_error;
  string error_type;
  double weight_error;
  HighsInt high_weight_error;
  HighsInt low_weight_error;
  bool accept_weight;
  double kWeightErrorThreshold;
  double local_80;
  double local_78 [3];
  allocator local_59;
  string local_58 [32];
  double local_38;
  int local_2c;
  int local_28;
  byte local_21;
  undefined8 local_20;
  double local_18;
  double local_10;
  
  local_20 = 0x4010000000000000;
  local_21 = in_XMM0_Qa * 0.25 <= in_XMM1_Qa;
  local_28 = 0;
  local_2c = 0;
  local_18 = in_XMM1_Qa;
  local_10 = in_XMM0_Qa;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"  OK",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  *(int *)(in_RDI + 0x948) = *(int *)(in_RDI + 0x948) + 1;
  if ((local_21 & 1) == 0) {
    *(int *)(in_RDI + 0x94c) = *(int *)(in_RDI + 0x94c) + 1;
  }
  if (local_10 <= local_18) {
    local_38 = local_18 / local_10;
    if (4.0 < local_38) {
      local_2c = 1;
      std::__cxx11::string::operator=(local_58,"High");
    }
    dVar1 = *(double *)(in_RDI + 0x970);
    dVar3 = log(local_38);
    *(double *)(in_RDI + 0x970) = dVar1 * 0.99 + dVar3 * 0.01;
  }
  else {
    local_38 = local_10 / local_18;
    if (4.0 < local_38) {
      local_28 = 1;
      std::__cxx11::string::operator=(local_58," Low");
    }
    dVar1 = *(double *)(in_RDI + 0x968);
    dVar3 = log(local_38);
    *(double *)(in_RDI + 0x968) = dVar1 * 0.99 + dVar3 * 0.01;
  }
  *(double *)(in_RDI + 0x958) = *(double *)(in_RDI + 0x958) * 0.99 + (double)local_28 * 0.01;
  *(double *)(in_RDI + 0x960) = *(double *)(in_RDI + 0x960) * 0.99 + (double)local_2c * 0.01;
  pdVar2 = std::max<double>((double *)(in_RDI + 0x978),(double *)(in_RDI + 0x958));
  *(double *)(in_RDI + 0x978) = *pdVar2;
  pdVar2 = std::max<double>((double *)(in_RDI + 0x980),(double *)(in_RDI + 0x960));
  *(double *)(in_RDI + 0x980) = *pdVar2;
  local_78[0] = *(double *)(in_RDI + 0x958) + *(double *)(in_RDI + 0x960);
  pdVar2 = std::max<double>((double *)(in_RDI + 0x988),local_78);
  *(double *)(in_RDI + 0x988) = *pdVar2;
  pdVar2 = std::max<double>((double *)(in_RDI + 0x990),(double *)(in_RDI + 0x968));
  *(double *)(in_RDI + 0x990) = *pdVar2;
  pdVar2 = std::max<double>((double *)(in_RDI + 0x998),(double *)(in_RDI + 0x970));
  *(double *)(in_RDI + 0x998) = *pdVar2;
  local_80 = *(double *)(in_RDI + 0x968) + *(double *)(in_RDI + 0x970);
  pdVar2 = std::max<double>((double *)(in_RDI + 0x9a0),&local_80);
  *(double *)(in_RDI + 0x9a0) = *pdVar2;
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void HighsSimplexAnalysis::dualSteepestEdgeWeightError(
    const double computed_edge_weight, const double updated_edge_weight) {
  const double kWeightErrorThreshold = 4.0;
  const bool accept_weight =
      updated_edge_weight >= kAcceptDseWeightThreshold * computed_edge_weight;
  HighsInt low_weight_error = 0;
  HighsInt high_weight_error = 0;
  double weight_error;
  string error_type = "  OK";
  num_dual_steepest_edge_weight_check++;
  if (!accept_weight) num_dual_steepest_edge_weight_reject++;
  if (updated_edge_weight < computed_edge_weight) {
    // Updated weight is low
    weight_error = computed_edge_weight / updated_edge_weight;
    if (weight_error > kWeightErrorThreshold) {
      low_weight_error = 1;
      error_type = " Low";
    }
    average_log_low_dual_steepest_edge_weight_error =
        0.99 * average_log_low_dual_steepest_edge_weight_error +
        0.01 * log(weight_error);
  } else {
    // Updated weight is correct or high
    weight_error = updated_edge_weight / computed_edge_weight;
    if (weight_error > kWeightErrorThreshold) {
      high_weight_error = 1;
      error_type = "High";
    }
    average_log_high_dual_steepest_edge_weight_error =
        0.99 * average_log_high_dual_steepest_edge_weight_error +
        0.01 * log(weight_error);
  }
  average_frequency_low_dual_steepest_edge_weight =
      0.99 * average_frequency_low_dual_steepest_edge_weight +
      0.01 * low_weight_error;
  average_frequency_high_dual_steepest_edge_weight =
      0.99 * average_frequency_high_dual_steepest_edge_weight +
      0.01 * high_weight_error;
  max_average_frequency_low_dual_steepest_edge_weight =
      max(max_average_frequency_low_dual_steepest_edge_weight,
          average_frequency_low_dual_steepest_edge_weight);
  max_average_frequency_high_dual_steepest_edge_weight =
      max(max_average_frequency_high_dual_steepest_edge_weight,
          average_frequency_high_dual_steepest_edge_weight);
  max_sum_average_frequency_extreme_dual_steepest_edge_weight =
      max(max_sum_average_frequency_extreme_dual_steepest_edge_weight,
          average_frequency_low_dual_steepest_edge_weight +
              average_frequency_high_dual_steepest_edge_weight);
  max_average_log_low_dual_steepest_edge_weight_error =
      max(max_average_log_low_dual_steepest_edge_weight_error,
          average_log_low_dual_steepest_edge_weight_error);
  max_average_log_high_dual_steepest_edge_weight_error =
      max(max_average_log_high_dual_steepest_edge_weight_error,
          average_log_high_dual_steepest_edge_weight_error);
  max_sum_average_log_extreme_dual_steepest_edge_weight_error =
      max(max_sum_average_log_extreme_dual_steepest_edge_weight_error,
          average_log_low_dual_steepest_edge_weight_error +
              average_log_high_dual_steepest_edge_weight_error);
  if (analyse_simplex_runtime_data) {
    const bool report_weight_error = false;
    if (report_weight_error && weight_error > 0.5 * kWeightErrorThreshold) {
      printf(
          "DSE Wt Ck |%8" HIGHSINT_FORMAT "| OK = %1d (%4" HIGHSINT_FORMAT
          " / %6" HIGHSINT_FORMAT
          ") (c %10.4g, u %10.4g, er %10.4g "
          "- "
          "%s): Low (Fq %10.4g, Er %10.4g); High (Fq%10.4g, Er%10.4g) | %10.4g "
          "%10.4g %10.4g %10.4g %10.4g %10.4g\n",
          simplex_iteration_count, accept_weight,
          num_dual_steepest_edge_weight_check,
          num_dual_steepest_edge_weight_reject, computed_edge_weight,
          updated_edge_weight, weight_error, error_type.c_str(),
          average_frequency_low_dual_steepest_edge_weight,
          average_log_low_dual_steepest_edge_weight_error,
          average_frequency_high_dual_steepest_edge_weight,
          average_log_high_dual_steepest_edge_weight_error,
          max_average_frequency_low_dual_steepest_edge_weight,
          max_average_frequency_high_dual_steepest_edge_weight,
          max_sum_average_frequency_extreme_dual_steepest_edge_weight,
          max_average_log_low_dual_steepest_edge_weight_error,
          max_average_log_high_dual_steepest_edge_weight_error,
          max_sum_average_log_extreme_dual_steepest_edge_weight_error);
    }
  }
}